

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<unsigned_int,reduceDB_lt>(uint *array,int size,reduceDB_lt lt)

{
  CRef y;
  uint uVar1;
  bool bVar2;
  int local_38;
  int local_34;
  int j;
  int i;
  uint tmp;
  uint pivot;
  int size_local;
  uint *array_local;
  reduceDB_lt lt_local;
  
  array_local = (uint *)lt.ca;
  if (size < 0x10) {
    selectionSort<unsigned_int,reduceDB_lt>(array,size,lt);
  }
  else {
    y = array[size / 2];
    local_34 = -1;
    local_38 = size;
    while( true ) {
      do {
        local_34 = local_34 + 1;
        bVar2 = reduceDB_lt::operator()((reduceDB_lt *)&array_local,array[local_34],y);
      } while (bVar2);
      do {
        local_38 = local_38 + -1;
        bVar2 = reduceDB_lt::operator()((reduceDB_lt *)&array_local,y,array[local_38]);
      } while (bVar2);
      if (local_38 <= local_34) break;
      uVar1 = array[local_34];
      array[local_34] = array[local_38];
      array[local_38] = uVar1;
    }
    sort<unsigned_int,reduceDB_lt>(array,local_34,(reduceDB_lt)array_local);
    sort<unsigned_int,reduceDB_lt>(array + local_34,size - local_34,(reduceDB_lt)array_local);
  }
  return;
}

Assistant:

void sort(T* array, int size, LessThan lt)
{
    if (size <= 15)
        selectionSort(array, size, lt);

    else{
        T           pivot = array[size / 2];
        T           tmp;
        int         i = -1;
        int         j = size;

        for(;;){
            do i++; while(lt(array[i], pivot));
            do j--; while(lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }

        sort(array    , i     , lt);
        sort(&array[i], size-i, lt);
    }
}